

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_internal.h
# Opt level: O1

int exploration::generate_softmax<ACTION_SCORE::score_iterator,ACTION_SCORE::score_iterator>
              (float lambda,long scores_first,long scores_last,long param_4,long param_5)

{
  float fVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  
  uVar2 = *(ulong *)(scores_first + 8);
  iVar4 = 1;
  if ((uVar2 <= *(ulong *)(scores_last + 8)) && (*(ulong *)(param_4 + 8) <= *(ulong *)(param_5 + 8))
     ) {
    uVar5 = (long)(*(ulong *)(scores_last + 8) - uVar2) >> 3;
    uVar10 = (long)(*(ulong *)(param_5 + 8) - *(ulong *)(param_4 + 8)) >> 3;
    if (uVar5 != uVar10) {
      if (uVar10 < uVar5) {
        uVar5 = uVar10;
      }
      *(ulong *)(scores_last + 8) = uVar2 + uVar5 * 8;
      lVar6 = uVar5 * 8 + *(long *)(param_4 + 8);
      lVar8 = lVar6;
      if (lVar6 != *(long *)(param_5 + 8)) {
        do {
          *(undefined4 *)(lVar8 + 4) = 0;
          lVar8 = lVar8 + 8;
        } while (lVar8 != *(long *)(param_5 + 8));
      }
      *(long *)(param_5 + 8) = lVar6;
    }
    lVar8 = *(long *)(param_4 + 8);
    if (*(long *)(param_5 + 8) != lVar8) {
      lVar6 = *(long *)(scores_first + 8);
      lVar3 = *(long *)(scores_last + 8);
      lVar7 = lVar6 + 8;
      lVar9 = lVar6;
      lVar11 = lVar6;
      if (lVar7 != lVar3 && lVar6 != lVar3) {
        do {
          lVar9 = lVar7;
          if (*(float *)(lVar7 + 4) < *(float *)(lVar11 + 4) ||
              *(float *)(lVar7 + 4) == *(float *)(lVar11 + 4)) {
            lVar9 = lVar11;
          }
          lVar7 = lVar7 + 8;
          lVar11 = lVar9;
        } while (lVar7 != lVar3);
      }
      if (lVar8 == *(long *)(param_5 + 8)) {
        fVar13 = 0.0;
      }
      else {
        fVar1 = *(float *)(lVar9 + 4);
        fVar13 = 0.0;
        do {
          if (lVar6 == *(long *)(scores_last + 8)) break;
          fVar12 = expf((*(float *)(lVar6 + 4) - fVar1) * lambda);
          fVar13 = fVar13 + fVar12;
          *(float *)(lVar8 + 4) = fVar12;
          lVar8 = lVar8 + 8;
          lVar6 = lVar6 + 8;
        } while (lVar8 != *(long *)(param_5 + 8));
      }
      iVar4 = 0;
      for (lVar8 = *(long *)(param_4 + 8); lVar8 != *(long *)(param_5 + 8); lVar8 = lVar8 + 8) {
        *(float *)(lVar8 + 4) = *(float *)(lVar8 + 4) / fVar13;
      }
    }
  }
  return iVar4;
}

Assistant:

int generate_softmax(float lambda, InputIt scores_first, InputIt scores_last, std::input_iterator_tag /* scores_tag */, OutputIt pdf_first, OutputIt pdf_last, std::random_access_iterator_tag /* pdf_tag */)
  {
    if (scores_last < scores_first || pdf_last < pdf_first)
      return E_EXPLORATION_BAD_RANGE;

    size_t num_actions_scores = scores_last - scores_first;
    size_t num_actions_pdf = pdf_last - pdf_first;

    if (num_actions_scores != num_actions_pdf)
    {
      // fallback to the minimum
      scores_last = scores_first + ((std::min)(num_actions_scores, num_actions_pdf));
      OutputIt pdf_new_last = pdf_first + ((std::min)(num_actions_scores, num_actions_pdf));

      // zero out pdf
      for (OutputIt d = pdf_new_last; d != pdf_last; ++d)
        *d = 0;

      pdf_last = pdf_new_last;
    }

    if (pdf_last - pdf_first == 0)
      return E_EXPLORATION_BAD_RANGE;

    float norm = 0.;
    float max_score = *std::max_element(scores_first, scores_last);

    InputIt s = scores_first;
    for (OutputIt d = pdf_first; d != pdf_last && s != scores_last; ++d, ++s)
    {
      float prob = exp(lambda*(*s - max_score));
      norm += prob;

      *d = prob;
    }

    // normalize
    for (OutputIt d = pdf_first; d != pdf_last; ++d)
      *d /= norm;

    return S_EXPLORATION_OK;
  }